

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i *palVar3;
  __m128i *palVar4;
  int a;
  int iVar5;
  int iVar6;
  __m128i *b;
  __m128i *ptr;
  __m128i *palVar7;
  uint uVar8;
  int imm;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  undefined4 in_register_00000084;
  longlong lVar9;
  longlong in_R9;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  uint uVar10;
  __m128i c;
  __m128i c_00;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i alVar11;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i vCompare;
  __m128i vT_5;
  __m128i cond_4;
  __m128i vEa_ext_1;
  __m128i vEa_1;
  __m128i vT_4;
  __m128i cond_3;
  __m128i vTAll_3;
  __m128i cond_2;
  __m128i case2_1;
  __m128i case1_1;
  __m128i vT_3;
  __m128i vTAll_2;
  __m128i vHp;
  __m128i vT_2;
  __m128i cond_1;
  __m128i vTAll_1;
  __m128i vT_1;
  __m128i cond;
  __m128i vEa_ext;
  __m128i vEa;
  __m128i vT;
  __m128i case2;
  __m128i case1;
  __m128i cond_zero;
  __m128i vTAll;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *tmp_1;
  __m128i *tmp;
  __m128i *vP;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFa_ext;
  __m128i vFa;
  __m128i vF_ext;
  __m128i vF;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  __m128i vFTMask;
  __m128i vTMask;
  __m128i vTDelF;
  __m128i vTDiagF;
  __m128i vTInsE;
  __m128i vTDiagE;
  __m128i vTDiag;
  __m128i vTDel;
  __m128i vTIns;
  __m128i vTZero;
  parasail_result_t *result;
  undefined8 uStack_868;
  int32_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  int32_t local_83c;
  int32_t score;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvHMax;
  __m128i *pvHT;
  __m128i *pvEaLoad;
  __m128i *pvEaStore;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_7b0;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  size_t len;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  ulong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  longlong extraout_RDX_07;
  
  lVar9 = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace_striped_profile_sse2_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_trace_striped_profile_sse2_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_trace_striped_profile_sse2_128_32","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace_striped_profile_sse2_128_32","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_trace_striped_profile_sse2_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_7b0 = 0;
    iVar6 = profile->s1Len;
    a = (iVar6 + 3) / 4;
    local_83c = -0x40000000;
    vMaxHUnit[1] = 0;
    vMaxH[0] = 0;
    uStack_868 = 0;
    vMaxHUnit[0] = 0;
    iVar5 = profile->matrix->max;
    profile_local = (parasail_profile_t *)parasail_result_new_trace(a,s2Len,0x10,0x10);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      uVar8 = *(uint *)&profile_local->field_0xc | 0x4480804;
      len = (size_t)uVar8;
      *(uint *)&profile_local->field_0xc = uVar8;
      pvHLoad = parasail_memalign___m128i(0x10,(long)a);
      pvE = parasail_memalign___m128i(0x10,(long)a);
      b = parasail_memalign___m128i(0x10,(long)a);
      pvEaLoad = parasail_memalign___m128i(0x10,(long)a);
      pvHT = parasail_memalign___m128i(0x10,(long)a);
      ptr = parasail_memalign___m128i(0x10,(long)a);
      vGapO[1] = (longlong)parasail_memalign___m128i(0x10,(long)a);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvEaLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHT == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if ((__m128i *)vGapO[1] == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar11[0] = (long)a;
        alVar11[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,alVar11,len);
        c[0] = (long)a;
        c[1] = extraout_RDX_00;
        parasail_memset___m128i(b,c,len);
        c_00[0] = (long)a;
        c_00[1] = extraout_RDX_01;
        a_13[0] = pvEaLoad;
        parasail_memset___m128i(pvEaLoad,c_00,len);
        for (k = 0; k < a; k = k + 1) {
          a_13[0] = (__m128i *)
                    ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                    rowcols->score_row;
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = a;
          vH_00[1]._4_4_ = 0;
          arr_store(a_13[0],vH_00,0,(int32_t)lVar9,(int32_t)in_R9);
        }
        for (end_query = 0; palVar4 = pvHLoad, palVar7 = pvEaLoad, palVar3 = pvHT,
            b_09[0] = vGapO[1], end_query < s2Len; end_query = end_query + 1) {
          vH_05[0] = (ulong)end_query;
          b_09[1] = (ulong)(byte)s2[vH_05[0]];
          if (local_7b0 == end_query + -2) {
            vGapO[1] = (longlong)pvE;
            pvHLoad = (__m128i *)b_09[0];
          }
          else {
            pvHLoad = pvE;
          }
          pvE = palVar4;
          pvEaLoad = pvHT;
          pvHT = palVar7;
          for (k = 0; k < a; k = k + 1) {
            b_00[1] = (long)k * 0x10;
            a_00[1] = vH_05[0];
            a_00[0] = (longlong)a_13[0];
            b_00[0] = b_09[1];
            alVar11 = _mm_max_epi32_rpl(a_00,b_00);
            b_01[0] = alVar11[1];
            a_01[1] = vH_05[0];
            a_01[0] = (longlong)a_13[0];
            b_01[1] = b_00[1];
            alVar11 = _mm_max_epi32_rpl(a_01,b_01);
            b_02[0] = alVar11[1];
            a_02[1] = vH_05[0];
            a_02[0] = (longlong)a_13[0];
            b_02[1] = b_00[1];
            _mm_max_epi32_rpl(a_02,b_02);
            pvHLoad[k][0] = extraout_XMM0_Qa;
            pvHLoad[k][1] = extraout_XMM0_Qb;
            a_13[0] = (__m128i *)
                      ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                      rowcols->score_row;
            vH_05[0] = (ulong)(uint)k;
            b_09[1] = (ulong)(uint)end_query;
            alVar11 = arr_load(a_13[0],k,a,end_query);
            b_03[0] = alVar11[1];
            a_03[1] = vH_05[0];
            a_03[0] = (longlong)a_13[0];
            b_03[1] = b_09[1];
            mask[1] = in_R9;
            mask[0] = lVar9;
            alVar11 = _mm_blendv_epi8_rpl(a_03,b_03,mask);
            b_04[0] = alVar11[1];
            a_04[1] = vH_05[0];
            a_04[0] = (longlong)a_13[0];
            b_04[1] = b_09[1];
            mask_00[1] = in_R9;
            mask_00[0] = lVar9;
            alVar11 = _mm_blendv_epi8_rpl(a_04,b_04,mask_00);
            b_05[0] = alVar11[1];
            a_05[1] = vH_05[0];
            a_05[0] = (longlong)a_13[0];
            b_05[1] = b_09[1];
            mask_01[1] = in_R9;
            mask_01[0] = lVar9;
            _mm_blendv_epi8_rpl(a_05,b_05,mask_01);
            ptr[k][0] = extraout_XMM0_Qa_00;
            ptr[k][1] = extraout_XMM0_Qb_00;
            a_13[0] = (__m128i *)
                      ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                      rowcols->score_row;
            vH_01[0] = (ulong)(uint)k;
            b_09[1] = (ulong)(uint)end_query;
            vH_01[1]._0_4_ = a;
            vH_01[1]._4_4_ = 0;
            arr_store(a_13[0],vH_01,end_query,(int32_t)lVar9,(int32_t)in_R9);
            a_06[1] = vH_01[0];
            a_06[0] = (longlong)a_13[0];
            b_06[1] = b_09[1];
            b_06[0] = extraout_RDX_02;
            alVar11 = _mm_max_epi32_rpl(a_06,b_06);
            b_07[0] = alVar11[1];
            a_07[1] = vH_01[0];
            a_07[0] = (longlong)a_13[0];
            b_07[1] = b_09[1];
            alVar11 = _mm_max_epi32_rpl(a_07,b_07);
            b_08[0] = alVar11[1];
            b[k][0] = extraout_XMM0_Qa_02;
            b[k][1] = extraout_XMM0_Qb_02;
            b_08[1] = (long)k * 0x10;
            a_08[1] = vH_01[0];
            a_08[0] = (longlong)a_13[0];
            alVar11 = _mm_max_epi32_rpl(a_08,b_08);
            b_09[0] = alVar11[1];
            b_09[1] = (long)k * 0x10;
            palVar7 = palVar3 + k;
            (*palVar7)[0] = extraout_XMM0_Qa_03;
            (*palVar7)[1] = extraout_XMM0_Qb_03;
            vH_03[0] = vH_01[0];
            if (end_query + 1 < s2Len) {
              a_09[1] = vH_01[0];
              a_09[0] = (longlong)a_13[0];
              mask_02[1] = in_R9;
              mask_02[0] = lVar9;
              _mm_blendv_epi8_rpl(a_09,b_09,mask_02);
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              vH_02[0] = (ulong)(uint)k;
              b_09[1] = (ulong)(end_query + 1U);
              vH_02[1]._0_4_ = a;
              vH_02[1]._4_4_ = 0;
              arr_store(a_13[0],vH_02,end_query + 1U,(int32_t)lVar9,(int32_t)in_R9);
              b_09[0] = extraout_RDX_03;
              vH_03[0] = vH_02[0];
            }
            a_10[1] = vH_03[0];
            a_10[0] = (longlong)a_13[0];
            b_10[1] = b_09[1];
            b_10[0] = b_09[0];
            alVar11 = _mm_max_epi32_rpl(a_10,b_10);
            b_09[1] = alVar11[1];
            if (k + 1 < a) {
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              vH_05[0] = (ulong)(k + 1U);
              b_09[1] = (ulong)(uint)end_query;
              alVar11 = arr_load(a_13[0],k + 1U,a,end_query);
              b_11[0] = alVar11[1];
              a_11[1] = vH_05[0];
              a_11[0] = (longlong)a_13[0];
              b_11[1] = b_09[1];
              mask_03[1] = in_R9;
              mask_03[0] = lVar9;
              _mm_blendv_epi8_rpl(a_11,b_11,mask_03);
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              vH_03[0] = (ulong)(k + 1);
              vH_03[1]._0_4_ = a;
              vH_03[1]._4_4_ = 0;
              arr_store(a_13[0],vH_03,end_query,(int32_t)lVar9,(int32_t)in_R9);
              b_09[1] = extraout_RDX_04;
            }
            vH_05[0] = vH_03[0];
            vMaxHUnit[1] = extraout_XMM0_Qa_01;
            vMaxH[0] = extraout_XMM0_Qb_01;
          }
          for (end_ref = 0; end_ref < 4; end_ref = end_ref + 1) {
            imm = (a + -1) * 0x10;
            alVar11 = _mm_insert_epi32_rpl((__m128i)ZEXT416((uint)-open),(int32_t)b_09[1],imm);
            a_12[1]._4_4_ = 0;
            a_12._0_12_ = ZEXT812(0xc0000000);
            alVar11 = _mm_insert_epi32_rpl(a_12,(int32_t)alVar11[1],imm);
            alVar11 = _mm_insert_epi32_rpl((__m128i)ZEXT416((uint)-open),(int32_t)alVar11[1],imm);
            alVar11 = _mm_insert_epi32_rpl((__m128i)ZEXT816(0xc0000000),(int32_t)alVar11[1],imm);
            a_13[0] = (__m128i *)(ulong)(uint)-open;
            vH_05[0] = 0;
            a_13[1] = 0;
            alVar11 = _mm_insert_epi32_rpl(a_13,(int32_t)alVar11[1],imm);
            b_09[1] = alVar11[1];
            vF_ext[1] = extraout_XMM0_Qa_04;
            vF[0] = extraout_XMM0_Qb_04;
            for (k = 0; k < a; k = k + 1) {
              b_12[1] = (long)k * 0x10;
              a_14[1] = vH_05[0];
              a_14[0] = (longlong)a_13[0];
              b_12[0] = b_09[1];
              alVar11 = _mm_max_epi32_rpl(a_14,b_12);
              b_13[0] = alVar11[1];
              pvHLoad[k][0] = extraout_XMM0_Qa_05;
              pvHLoad[k][1] = extraout_XMM0_Qb_05;
              b_13[1] = (long)k * 0x10;
              a_15[1] = vH_05[0];
              a_15[0] = (longlong)a_13[0];
              _mm_max_epi32_rpl(a_15,b_13);
              local_438 = (int)extraout_XMM0_Qa_05;
              iStack_434 = (int)((ulong)extraout_XMM0_Qa_05 >> 0x20);
              iStack_430 = (int)extraout_XMM0_Qb_05;
              iStack_42c = (int)((ulong)extraout_XMM0_Qb_05 >> 0x20);
              local_468 = (int)vF_ext[1];
              iStack_464 = (int)((ulong)vF_ext[1] >> 0x20);
              iStack_460 = (int)vF[0];
              iStack_45c = (int)((ulong)vF[0] >> 0x20);
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              b_09[1] = (ulong)(uint)k;
              alVar11 = arr_load(a_13[0],k,a,end_query);
              b_14[0] = alVar11[1];
              b_14[1] = (long)k * 0x10;
              a_16[1] = b_09[1];
              a_16[0] = (longlong)a_13[0];
              mask_04[1] = in_R9;
              mask_04[0] = lVar9;
              _mm_blendv_epi8_rpl(a_16,b_14,mask_04);
              ptr[k][0] = extraout_XMM0_Qa_06;
              ptr[k][1] = extraout_XMM0_Qb_06;
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              vH_04[0] = (ulong)(uint)k;
              b_09[1] = (ulong)(uint)end_query;
              vH_04[1]._0_4_ = a;
              vH_04[1]._4_4_ = 0;
              arr_store(a_13[0],vH_04,end_query,(int32_t)lVar9,(int32_t)in_R9);
              a_17[1] = vH_04[0];
              a_17[0] = (longlong)a_13[0];
              b_15[1] = b_09[1];
              b_15[0] = extraout_RDX_05;
              _mm_max_epi32_rpl(a_17,b_15);
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              vH_05[0] = (ulong)(uint)k;
              b_09[1] = (ulong)(uint)end_query;
              alVar11 = arr_load(a_13[0],k,a,end_query);
              b_16[0] = alVar11[1];
              a_18[1] = vH_05[0];
              a_18[0] = (longlong)a_13[0];
              b_16[1] = b_09[1];
              mask_05[1] = in_R9;
              mask_05[0] = lVar9;
              _mm_blendv_epi8_rpl(a_18,b_16,mask_05);
              a_13[0] = (__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row;
              vH_05[0] = (ulong)(uint)k;
              vH_05[1]._0_4_ = a;
              vH_05[1]._4_4_ = 0;
              arr_store(a_13[0],vH_05,end_query,(int32_t)lVar9,(int32_t)in_R9);
              local_468 = local_468 - gap;
              iStack_464 = iStack_464 - gap;
              iStack_460 = iStack_460 - gap;
              iStack_45c = iStack_45c - gap;
              vFa[1] = CONCAT44(iStack_464,local_468);
              vF_ext[0] = CONCAT44(iStack_45c,iStack_460);
              b_17[1] = (long)k * 0x10;
              a_19[1] = vH_05[0];
              a_19[0] = (longlong)a_13[0];
              b_17[0] = extraout_RDX_06;
              alVar11 = _mm_max_epi32_rpl(a_19,b_17);
              b_18[0] = alVar11[1];
              b_18[1] = (long)k * 0x10;
              palVar7 = palVar3 + k;
              (*palVar7)[0] = extraout_XMM0_Qa_08;
              (*palVar7)[1] = extraout_XMM0_Qb_08;
              if (end_query + 1 < s2Len) {
                a_20[1] = vH_05[0];
                a_20[0] = (longlong)a_13[0];
                mask_06[1] = in_R9;
                mask_06[0] = lVar9;
                _mm_blendv_epi8_rpl(a_20,b_18,mask_06);
                a_13[0] = (__m128i *)
                          ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)
                          ->rowcols->score_row;
                vH_06[0] = (ulong)(uint)k;
                b_18[1] = (ulong)(end_query + 1U);
                vH_06[1]._0_4_ = a;
                vH_06[1]._4_4_ = 0;
                arr_store(a_13[0],vH_06,end_query + 1U,(int32_t)lVar9,(int32_t)in_R9);
                b_18[0] = extraout_RDX_07;
                vH_05[0] = vH_06[0];
              }
              b_09[1] = CONCAT44(-(uint)(iStack_42c - open < iStack_45c),
                                 -(uint)(iStack_430 - open < iStack_460)) |
                        CONCAT44(-(uint)(iStack_45c == iStack_42c - open),
                                 -(uint)(iStack_460 == iStack_430 - open));
              auVar2._8_8_ = b_09[1];
              auVar2._0_8_ = CONCAT44(-(uint)(iStack_434 - open < iStack_464),
                                      -(uint)(local_438 - open < local_468)) |
                             CONCAT44(-(uint)(iStack_464 == iStack_434 - open),
                                      -(uint)(local_468 == local_438 - open));
              vMaxHUnit[1] = extraout_XMM0_Qa_07;
              vMaxH[0] = extraout_XMM0_Qb_07;
              if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar2 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar2 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar2 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar2 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar2 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (b_09[1] >> 7 & 1) == 0) && (b_09[1] >> 0xf & 1) == 0) &&
                      (b_09[1] >> 0x17 & 1) == 0) && (b_09[1] >> 0x1f & 1) == 0) &&
                    (b_09[1] >> 0x27 & 1) == 0) && (b_09[1] >> 0x2f & 1) == 0) &&
                  (b_09[1] >> 0x37 & 1) == 0) && -1 < (long)b_09[1]) goto LAB_0087476c;
              vF_ext[1] = vFa[1];
              vF[0] = vF_ext[0];
              a_21[1] = vH_05[0];
              a_21[0] = (longlong)a_13[0];
              b_19[1] = b_18[1];
              b_19[0] = b_18[0];
              alVar11 = _mm_max_epi32_rpl(a_21,b_19);
              b_09[1] = alVar11[1];
            }
          }
LAB_0087476c:
          local_318 = (int)vMaxHUnit[1];
          iStack_314 = (int)((ulong)vMaxHUnit[1] >> 0x20);
          iStack_310 = (int)vMaxH[0];
          iStack_30c = (int)((ulong)vMaxH[0] >> 0x20);
          local_328 = (int)uStack_868;
          iStack_324 = (int)((ulong)uStack_868 >> 0x20);
          iStack_320 = (int)vMaxHUnit[0];
          iStack_31c = (int)((ulong)vMaxHUnit[0] >> 0x20);
          uVar8 = -(uint)(iStack_320 < iStack_310);
          uVar10 = -(uint)(iStack_31c < iStack_30c);
          auVar1._4_4_ = -(uint)(iStack_324 < iStack_314);
          auVar1._0_4_ = -(uint)(local_328 < local_318);
          auVar1._12_4_ = uVar10;
          auVar1._8_4_ = uVar8;
          if ((((((((((((((((auVar1 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar1 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar1 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar1 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar1 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar1 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar1 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar1 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar8 & 0x80) != 0) || (uVar8 & 0x8000) != 0) || (uVar8 & 0x800000) != 0) ||
                 uVar8 != 0) || (uVar10 >> 7 & 1) != 0) || (uVar10 >> 0xf & 1) != 0) ||
              (uVar10 >> 0x17 & 1) != 0) || iStack_31c < iStack_30c) {
            a_22[1] = vH_05[0];
            a_22[0] = (longlong)a_13[0];
            local_83c = _mm_hmax_epi32_rpl(a_22);
            if (0x7ffffffe - iVar5 < local_83c) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            uStack_868 = CONCAT44(local_83c,local_83c);
            vMaxHUnit[0] = CONCAT44(local_83c,local_83c);
            local_7b0 = end_query;
          }
        }
        lVar9 = vGapO[1];
        if (local_83c == 0x7fffffff) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar5 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar5 == 0) {
          if (local_7b0 == end_query + -1) {
            vGapO[1] = (longlong)pvHLoad;
            pvHLoad = (__m128i *)lVar9;
          }
          else if (local_7b0 == end_query + -2) {
            vGapO[1] = (longlong)pvE;
            pvE = (__m128i *)lVar9;
          }
          _temp = (int *)vGapO[1];
          s1Len = iVar6 + -1;
          for (k = 0; k < a * 4; k = k + 1) {
            if ((*_temp == local_83c) && (iVar6 = k / 4 + (k % 4) * a, iVar6 < s1Len)) {
              s1Len = iVar6;
            }
            _temp = _temp + 1;
          }
        }
        else {
          local_83c = 0;
          s1Len = 0;
          local_7b0 = 0;
        }
        *(int32_t *)&profile_local->s1 = local_83c;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_7b0;
        parasail_free((void *)vGapO[1]);
        parasail_free(ptr);
        parasail_free(pvHT);
        parasail_free(pvEaLoad);
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    vTZero = _mm_set1_epi32(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi32(PARASAIL_INS);
    vTDel  = _mm_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi32(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_sub_epi32(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi32_rpl(vH_dag, vZero);
            vH = _mm_max_epi32_rpl(vH_dag, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi32(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi32(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi32(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 4);
            vEF_opn = _mm_slli_si128(vEF_opn, 4);
            vEF_opn = _mm_insert_epi32_rpl(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 4);
            vF_ext = _mm_insert_epi32_rpl(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 4);
            vFa_ext = _mm_insert_epi32_rpl(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 4);
            vFa = _mm_insert_epi32_rpl(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi32_rpl(vHp, vZero);
                    case1 = _mm_cmpeq_epi32(vH, vHp);
                    case2 = _mm_cmpeq_epi32(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                    vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_sub_epi32(vFa, vGapE);
                vFa = _mm_max_epi32_rpl(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}